

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  Module *this_00;
  Location local_b0;
  unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> local_90;
  Location local_88;
  undefined1 local_68 [8];
  Var start;
  Index func_index_local;
  BinaryReaderIR *this_local;
  
  start.field_2._28_4_ = func_index;
  GetLocation(&local_88,this);
  Var::Var((Var *)local_68,func_index,&local_88);
  this_00 = this->module_;
  GetLocation(&local_b0,this);
  MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location>
            ((wabt *)&local_90,(Var *)local_68,&local_b0);
  Module::AppendField(this_00,&local_90);
  std::unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>::~unique_ptr
            (&local_90);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Var::~Var((Var *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  Var start(func_index, GetLocation());
  module_->AppendField(MakeUnique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}